

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall
wabt::AST::Get<(wabt::ExprType)22>(AST *this,VarExpr<(wabt::ExprType)22> *ve,bool local)

{
  bool bVar1;
  string *__a;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  pVar3;
  reference local_90;
  _Base_ptr local_80;
  undefined1 local_78;
  Variable local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>
  local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  ret;
  bool local_local;
  VarExpr<(wabt::ExprType)22> *ve_local;
  AST *this_local;
  
  ret._15_1_ = local;
  if (local) {
    __a = Var::name_abi_cxx11_(&ve->var);
    local_70.block_id = this->cur_block_id;
    local_70.defined = false;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_true>
              (&local_60,__a,&local_70);
    pVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
            ::insert(&this->vars_defined,&local_60);
    local_80 = (_Base_ptr)pVar3.first._M_node;
    local_78 = pVar3.second;
    local_30._M_node = local_80;
    ret.first._M_node._0_1_ = local_78;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
    ::~pair(&local_60);
    if (((byte)ret.first._M_node & 1) == 0) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>
               ::operator->(&local_30);
      local_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->blocks_closed,(ppVar2->second).block_id);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_90);
      if (bVar1) {
        PreDecl<(wabt::ExprType)22>(this,ve);
      }
    }
    else {
      PreDecl<(wabt::ExprType)22>(this,ve);
    }
  }
  InsertNode(this,Expr,LocalGet,(Expr *)ve,0);
  return;
}

Assistant:

void Get(const VarExpr<T>& ve, bool local) {
    if (local) {
      auto ret = vars_defined.insert({ ve.var.name(), { cur_block_id, false }});
      if (ret.second) {
        // Use before def, may happen since locals are guaranteed 0.
        PreDecl(ve);
      } else if (blocks_closed[ret.first->second.block_id]) {
        // This is a use of a variable that was defined in a block that has
        // already ended. This happens rarely, but we should cater for this
        // case by lifting it to the top scope.
        PreDecl(ve);
      }
    }
    InsertNode(NodeType::Expr, T, &ve, 0);
  }